

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# grid.cpp
# Opt level: O2

void __thiscall cg_box::cg_box(cg_box *this,s_i raw,int sep,int just,int fill,bool *empty)

{
  int iVar1;
  int iVar2;
  int *piVar3;
  ulong uVar4;
  int iVar5;
  int iVar6;
  ulong uVar7;
  int iVar8;
  bool bVar9;
  s_i x;
  
  x.i = raw.i;
  x.s = raw.s;
  x.utf8 = raw.utf8;
  x._9_7_ = raw._9_7_;
  iVar8 = 0;
  iVar5 = 0;
  iVar6 = 0;
  while( true ) {
    iVar2 = iVar8;
    if (iVar8 < iVar6) {
      iVar2 = iVar6;
    }
    if (((x.s)->_M_dataplus)._M_p + (x.s)->_M_string_length <= x.i) break;
    iVar1 = s_i::get(&x);
    iVar8 = iVar8 + 1;
    if (iVar1 == sep) {
      iVar8 = 0;
      iVar6 = iVar2;
    }
    iVar5 = iVar5 + (uint)(iVar1 == sep);
  }
  bVar9 = iVar8 != 0;
  if (bVar9) {
    iVar6 = iVar2;
  }
  *empty = iVar6 < 1;
  if (iVar6 < 1) {
    fill = -0x80000000;
  }
  iVar8 = 1;
  if (1 < iVar6) {
    iVar8 = iVar6;
  }
  iVar6 = iVar5 + (uint)bVar9 + (uint)(iVar5 + (uint)bVar9 == 0);
  this->w = iVar8;
  this->h = iVar6;
  uVar7 = (ulong)(uint)(iVar6 * iVar8);
  piVar3 = (int *)operator_new__(uVar7 * 4);
  this->data = piVar3;
  for (uVar4 = 0; uVar7 != uVar4; uVar4 = uVar4 + 1) {
    piVar3[uVar4] = fill;
  }
  x.i = raw.i;
  x.s = raw.s;
  x.utf8 = raw.utf8;
  x._9_7_ = raw._9_7_;
  iVar8 = 0;
  do {
    iVar5 = -1;
    iVar6 = 0;
    while( true ) {
      if (((x.s)->_M_dataplus)._M_p + (x.s)->_M_string_length <= x.i) {
        return;
      }
      iVar2 = s_i::get(&x);
      if (iVar2 == sep) break;
      iVar1 = this->w + iVar5;
      if (just != 1) {
        iVar1 = iVar6;
      }
      this->data[iVar1 + this->w * iVar8] = iVar2;
      iVar6 = iVar6 + 1;
      iVar5 = iVar5 + -1;
    }
    iVar8 = iVar8 + 1;
  } while( true );
}

Assistant:

cg_box(s_i raw, int sep, int just, int fill, bool &empty) {
        int maxrow = 0, nrows = 0, rlen = 0;
        for (s_i x = raw; !x.atEnd(); ) {
            if (x.get() == sep) {
                maxrow = max(maxrow, rlen);
                rlen = 0;
                nrows++;
            } else {
                rlen++;
            }
        }
        if (rlen) {
            maxrow = max(maxrow, rlen);
            nrows++;
        }
        empty = maxrow < 1;
        if (empty) fill = OUT_CHAR;
        w = max(1, maxrow);
        h = max(1, nrows);
        data = new int[w*h];
        for (int i = 0; i < w*h; i++) data[i] = fill;

        int row = 0, col = 0;
        for (s_i x = raw; !x.atEnd();) {
            int c = x.get();
            if (c == sep) {
                col = 0;
                row++;
            } else {
                data[w*row + (just == 1 ? w - 1 - col : col)] = c;
                col++;
            }
        }
    }